

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ping-pong.c
# Opt level: O0

void pinger_on_connect(uv_connect_t *req,int status)

{
  pinger_t *pinger_00;
  int iVar1;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  pinger_t *pinger;
  int status_local;
  uv_connect_t *req_local;
  
  pinger_00 = (pinger_t *)req->handle->data;
  pinger_on_connect_count = pinger_on_connect_count + 1;
  if ((long)status != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ping-pong.c"
            ,200,"status","==","0",(long)status,"==",0);
    abort();
  }
  iVar1 = uv_is_readable(req->handle);
  if ((long)iVar1 != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ping-pong.c"
            ,0xca,"1","==","uv_is_readable(req->handle)",1,"==",(long)iVar1);
    abort();
  }
  iVar1 = uv_is_writable(req->handle);
  if ((long)iVar1 != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ping-pong.c"
            ,0xcb,"1","==","uv_is_writable(req->handle)",1,"==",(long)iVar1);
    abort();
  }
  iVar1 = uv_is_closing(req->handle);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ping-pong.c"
            ,0xcc,"uv_is_closing((uv_handle_t *) req->handle)","==","0",(long)iVar1,"==",0);
    abort();
  }
  pinger_write_ping(pinger_00);
  iVar1 = uv_read_start(req->handle,alloc_cb,pinger_read_cb);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ping-pong.c"
            ,0xd2,"uv_read_start((uv_stream_t*) req->handle, alloc_cb, pinger_read_cb)","==","0",
            (long)iVar1,"==",0);
    abort();
  }
  return;
}

Assistant:

static void pinger_on_connect(uv_connect_t* req, int status) {
  pinger_t* pinger = (pinger_t*) req->handle->data;

  pinger_on_connect_count++;

  ASSERT_OK(status);

  ASSERT_EQ(1, uv_is_readable(req->handle));
  ASSERT_EQ(1, uv_is_writable(req->handle));
  ASSERT_OK(uv_is_closing((uv_handle_t *) req->handle));

  pinger_write_ping(pinger);

  ASSERT_OK(uv_read_start((uv_stream_t*) req->handle,
                          alloc_cb,
                          pinger_read_cb));
}